

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_decompressMultiFrame
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_DDict *ddict)

{
  U32 UVar1;
  uint uVar2;
  ZSTD_ErrorCode ZVar3;
  ZSTD_DCtx *code;
  void *in_RSI;
  ZSTD_DCtx *in_RDI;
  void *in_R8;
  size_t res;
  size_t errcod_1;
  size_t errcod;
  size_t skippableSize;
  U32 magicNumber;
  int moreThan1Frame;
  void *dststart;
  void *in_stack_ffffffffffffff98;
  ZSTD_DCtx *in_stack_ffffffffffffffa0;
  ZSTD_DCtx *in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb0;
  int iVar4;
  void *local_30;
  void *local_18;
  size_t *in_stack_fffffffffffffff8;
  size_t sVar5;
  
  iVar4 = 0;
  local_30 = in_R8;
  local_18 = in_RSI;
  if (errcod != 0) {
    ZSTD_DDictDictContent((ZSTD_DDict *)errcod);
    errcod_1 = ZSTD_DDictDictSize((ZSTD_DDict *)errcod);
  }
  while( true ) {
    while( true ) {
      if (local_30 < (void *)0x5) {
        if (local_30 == (void *)0x0) {
          sVar5 = (long)local_18 - (long)in_RSI;
        }
        else {
          sVar5 = 0xffffffffffffffb8;
        }
        return sVar5;
      }
      UVar1 = MEM_readLE32(in_stack_ffffffffffffff98);
      if ((UVar1 & 0xfffffff0) == 0x184d2a50) break;
      if (errcod == 0) {
        in_stack_ffffffffffffffa0 =
             (ZSTD_DCtx *)
             ZSTD_decompressBegin_usingDict
                       ((ZSTD_DCtx *)CONCAT44(iVar4,UVar1),in_stack_ffffffffffffffb0,
                        (size_t)in_stack_ffffffffffffffa8);
        uVar2 = ERR_isError((size_t)in_stack_ffffffffffffffa0);
        code = in_stack_ffffffffffffffa0;
      }
      else {
        code = (ZSTD_DCtx *)
               ZSTD_decompressBegin_usingDDict
                         (in_stack_ffffffffffffffa8,(ZSTD_DDict *)in_stack_ffffffffffffffa0);
        uVar2 = ERR_isError((size_t)code);
        in_stack_ffffffffffffffa8 = code;
      }
      if (uVar2 != 0) {
        return (size_t)code;
      }
      ZSTD_checkContinuity(in_RDI,local_18);
      in_stack_ffffffffffffff98 =
           (void *)ZSTD_decompressFrame
                             ((ZSTD_DCtx *)skippableSize,(void *)errcod,errcod_1,(void **)res,
                              in_stack_fffffffffffffff8);
      ZVar3 = ZSTD_getErrorCode(0x2953bc);
      if ((ZVar3 == ZSTD_error_prefix_unknown) && (iVar4 == 1)) {
        return 0xffffffffffffffb8;
      }
      uVar2 = ERR_isError((size_t)in_stack_ffffffffffffff98);
      if (uVar2 != 0) {
        return (size_t)in_stack_ffffffffffffff98;
      }
      local_18 = (void *)((long)local_18 + (long)in_stack_ffffffffffffff98);
      iVar4 = 1;
    }
    if (local_30 < (void *)0x8) {
      return 0xffffffffffffffb8;
    }
    UVar1 = MEM_readLE32(in_stack_ffffffffffffff98);
    in_stack_ffffffffffffffb0 = (void *)((ulong)UVar1 + 8);
    if (local_30 < in_stack_ffffffffffffffb0) break;
    local_30 = (void *)((long)local_30 - (long)in_stack_ffffffffffffffb0);
  }
  return 0xffffffffffffffb8;
}

Assistant:

static size_t ZSTD_decompressMultiFrame(ZSTD_DCtx* dctx,
                                        void* dst, size_t dstCapacity,
                                  const void* src, size_t srcSize,
                                  const void* dict, size_t dictSize,
                                  const ZSTD_DDict* ddict)
{
    void* const dststart = dst;
    int moreThan1Frame = 0;
    assert(dict==NULL || ddict==NULL);  /* either dict or ddict set, not both */

    if (ddict) {
        dict = ZSTD_DDictDictContent(ddict);
        dictSize = ZSTD_DDictDictSize(ddict);
    }

    while (srcSize >= ZSTD_frameHeaderSize_prefix) {

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
        if (ZSTD_isLegacy(src, srcSize)) {
            size_t decodedSize;
            size_t const frameSize = ZSTD_findFrameCompressedSizeLegacy(src, srcSize);
            if (ZSTD_isError(frameSize)) return frameSize;
            /* legacy support is not compatible with static dctx */
            if (dctx->staticSize) return ERROR(memory_allocation);

            decodedSize = ZSTD_decompressLegacy(dst, dstCapacity, src, frameSize, dict, dictSize);

            dst = (BYTE*)dst + decodedSize;
            dstCapacity -= decodedSize;

            src = (const BYTE*)src + frameSize;
            srcSize -= frameSize;

            continue;
        }
#endif

        {   U32 const magicNumber = MEM_readLE32(src);
            DEBUGLOG(4, "reading magic number %08X (expecting %08X)",
                        (U32)magicNumber, (U32)ZSTD_MAGICNUMBER);
            if ((magicNumber & 0xFFFFFFF0U) == ZSTD_MAGIC_SKIPPABLE_START) {
                size_t skippableSize;
                if (srcSize < ZSTD_skippableHeaderSize)
                    return ERROR(srcSize_wrong);
                skippableSize = MEM_readLE32((const BYTE*)src + ZSTD_frameIdSize)
                              + ZSTD_skippableHeaderSize;
                if (srcSize < skippableSize) return ERROR(srcSize_wrong);

                src = (const BYTE *)src + skippableSize;
                srcSize -= skippableSize;
                continue;
        }   }

        if (ddict) {
            /* we were called from ZSTD_decompress_usingDDict */
            CHECK_F(ZSTD_decompressBegin_usingDDict(dctx, ddict));
        } else {
            /* this will initialize correctly with no dict if dict == NULL, so
             * use this in all cases but ddict */
            CHECK_F(ZSTD_decompressBegin_usingDict(dctx, dict, dictSize));
        }
        ZSTD_checkContinuity(dctx, dst);

        {   const size_t res = ZSTD_decompressFrame(dctx, dst, dstCapacity,
                                                    &src, &srcSize);
            if ( (ZSTD_getErrorCode(res) == ZSTD_error_prefix_unknown)
              && (moreThan1Frame==1) ) {
                /* at least one frame successfully completed,
                 * but following bytes are garbage :
                 * it's more likely to be a srcSize error,
                 * specifying more bytes than compressed size of frame(s).
                 * This error message replaces ERROR(prefix_unknown),
                 * which would be confusing, as the first header is actually correct.
                 * Note that one could be unlucky, it might be a corruption error instead,
                 * happening right at the place where we expect zstd magic bytes.
                 * But this is _much_ less likely than a srcSize field error. */
                return ERROR(srcSize_wrong);
            }
            if (ZSTD_isError(res)) return res;
            /* no need to bound check, ZSTD_decompressFrame already has */
            dst = (BYTE*)dst + res;
            dstCapacity -= res;
        }
        moreThan1Frame = 1;
    }  /* while (srcSize >= ZSTD_frameHeaderSize_prefix) */

    if (srcSize) return ERROR(srcSize_wrong); /* input not entirely consumed */

    return (BYTE*)dst - (BYTE*)dststart;
}